

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

size_t mpack_node_copy_data(mpack_node_t node,char *buffer,size_t bufsize)

{
  mpack_type_t mVar1;
  mpack_error_t mVar2;
  char *__src;
  mpack_node_data_t *pmVar3;
  mpack_type_t type;
  size_t bufsize_local;
  char *buffer_local;
  mpack_node_t node_local;
  
  pmVar3 = node.data;
  mVar2 = mpack_node_error(node);
  if (mVar2 == mpack_ok) {
    mVar1 = pmVar3->type;
    if (((mVar1 == mpack_type_str) || (mVar1 == mpack_type_bin)) || (mVar1 == mpack_type_ext)) {
      if (bufsize < pmVar3->len) {
        mpack_node_flag_error(node,mpack_error_too_big);
        node_local.tree = (mpack_tree_t *)0x0;
      }
      else {
        __src = mpack_node_data_unchecked(node);
        memcpy(buffer,__src,(ulong)pmVar3->len);
        node_local.tree = (mpack_tree_t *)(ulong)pmVar3->len;
      }
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree = (mpack_tree_t *)0x0;
    }
  }
  else {
    node_local.tree = (mpack_tree_t *)0x0;
  }
  return (size_t)node_local.tree;
}

Assistant:

size_t mpack_node_copy_data(mpack_node_t node, char* buffer, size_t bufsize) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    mpack_assert(bufsize == 0 || buffer != NULL, "buffer is NULL for maximum of %i bytes", (int)bufsize);

    mpack_type_t type = node.data->type;
    if (type != mpack_type_str && type != mpack_type_bin && type != mpack_type_ext) {
        mpack_node_flag_error(node, mpack_error_type);
        return 0;
    }

    if (node.data->len > bufsize) {
        mpack_node_flag_error(node, mpack_error_too_big);
        return 0;
    }

    mpack_memcpy(buffer, mpack_node_data_unchecked(node), node.data->len);
    return (size_t)node.data->len;
}